

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

void test_ecmult_target(secp256k1_scalar *target,int mode)

{
  undefined1 *puVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  secp256k1_scratch_space *scratch;
  ulong extraout_RAX;
  code *pcVar5;
  long lVar6;
  secp256k1_ge *psVar7;
  long extraout_RDX;
  ulong uVar8;
  secp256k1_ge *scratch_00;
  size_t sVar9;
  secp256k1_gej *r;
  ulong uVar10;
  secp256k1_strauss_point_state *psVar11;
  byte *out32;
  secp256k1_gej *psVar12;
  secp256k1_ge *b;
  secp256k1_gej *psVar13;
  secp256k1_gej *psVar14;
  code *cb;
  secp256k1_ge *cbdata;
  secp256k1_fe *unaff_R12;
  secp256k1_callback *error_callback;
  secp256k1_ge *unaff_R13;
  secp256k1_scalar *psVar15;
  secp256k1_sha256 *psVar16;
  secp256k1_sha256 *hash;
  secp256k1_sha256 *psVar17;
  secp256k1_scalar n2;
  secp256k1_scalar n1;
  secp256k1_gej ptj;
  secp256k1_gej p2j;
  secp256k1_gej p1j;
  secp256k1_ge p;
  secp256k1_gej pj;
  secp256k1_fe aux [8];
  secp256k1_ge pre_a [8];
  secp256k1_strauss_point_state ps [1];
  ulong uStack_2378;
  secp256k1_strauss_state sStack_2368;
  secp256k1_strauss_point_state sStack_2350;
  secp256k1_fe asStack_1f40 [8];
  secp256k1_ge asStack_1dc0 [8];
  secp256k1_gej *psStack_1a78;
  secp256k1_callback *psStack_1a70;
  secp256k1_ge *psStack_1a60;
  secp256k1_strauss_point_state *psStack_1a58;
  secp256k1_scalar *psStack_1a50;
  undefined1 auStack_1a38 [8];
  undefined1 auStack_1a30 [176];
  secp256k1_gej sStack_1980;
  secp256k1_gej sStack_18e8;
  secp256k1_gej sStack_1850;
  secp256k1_gej sStack_17b8;
  secp256k1_gej sStack_1720;
  secp256k1_gej asStack_1688 [2];
  secp256k1_gej asStack_1508 [5];
  secp256k1_strauss_point_state sStack_11c8;
  secp256k1_scratch_space *psStack_db0;
  secp256k1_sha256 *psStack_da8;
  secp256k1_gej *psStack_da0;
  secp256k1_scalar *psStack_d98;
  secp256k1_gej *psStack_d90;
  code *pcStack_d88;
  undefined4 uStack_d7e;
  undefined2 uStack_d7a;
  long lStack_d78;
  byte abStack_d70 [32];
  secp256k1_scalar sStack_d50;
  secp256k1_sha256 sStack_d30;
  undefined1 auStack_cc0 [144];
  secp256k1_strauss_point_state *psStack_c30;
  undefined1 auStack_c28 [32];
  undefined1 local_c08 [40];
  secp256k1_ge *local_be0;
  secp256k1_strauss_point_state *local_bd8;
  secp256k1_gej local_bd0;
  secp256k1_gej local_b38;
  secp256k1_gej local_aa0;
  secp256k1_ge local_a08;
  secp256k1_gej local_9a0;
  secp256k1_fe local_908 [8];
  secp256k1_ge local_788 [8];
  secp256k1_strauss_point_state local_448;
  
  psVar14 = (secp256k1_gej *)auStack_c28;
  psVar11 = (secp256k1_strauss_point_state *)(ulong)(uint)mode;
  psVar15 = (secp256k1_scalar *)local_c08;
  psStack_c30 = (secp256k1_strauss_point_state *)0x14f8a2;
  testutil_random_scalar_order_test(psVar15);
  psStack_c30 = (secp256k1_strauss_point_state *)0x14f8b3;
  secp256k1_scalar_add((secp256k1_scalar *)auStack_c28,psVar15,target);
  psStack_c30 = (secp256k1_strauss_point_state *)0x14f8be;
  secp256k1_scalar_negate((secp256k1_scalar *)auStack_c28,(secp256k1_scalar *)auStack_c28);
  if (mode == 0) {
    psStack_c30 = (secp256k1_strauss_point_state *)0x14f9b7;
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&local_aa0,(secp256k1_scalar *)local_c08);
    psStack_c30 = (secp256k1_strauss_point_state *)0x14f9ce;
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&local_b38,(secp256k1_scalar *)auStack_c28);
    psStack_c30 = (secp256k1_strauss_point_state *)0x14f9e2;
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&local_bd0,target);
  }
  else {
    psStack_c30 = (secp256k1_strauss_point_state *)0x14f8d6;
    testutil_random_ge_test(&local_a08);
    psStack_c30 = (secp256k1_strauss_point_state *)0x14f8e6;
    secp256k1_gej_set_ge(&local_9a0,&local_a08);
    if (mode == 1) {
      unaff_R12 = local_908;
      unaff_R13 = local_788;
      psVar11 = &local_448;
      psVar15 = &secp256k1_scalar_zero;
      psStack_c30 = (secp256k1_strauss_point_state *)0x14f946;
      local_b38.x.n[0] = (uint64_t)unaff_R12;
      local_b38.x.n[1] = (uint64_t)unaff_R13;
      local_b38.x.n[2] = (uint64_t)psVar11;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&local_b38,&local_aa0,1,&local_9a0,
                 (secp256k1_scalar *)local_c08,&secp256k1_scalar_zero);
      psStack_c30 = (secp256k1_strauss_point_state *)0x14f971;
      local_bd0.x.n[0] = (uint64_t)unaff_R12;
      local_bd0.x.n[1] = (uint64_t)unaff_R13;
      local_bd0.x.n[2] = (uint64_t)psVar11;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&local_bd0,&local_b38,1,&local_9a0,
                 (secp256k1_scalar *)auStack_c28,&secp256k1_scalar_zero);
      psStack_c30 = (secp256k1_strauss_point_state *)0x14f999;
      local_c08._32_8_ = unaff_R12;
      local_be0 = unaff_R13;
      local_bd8 = psVar11;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)(local_c08 + 0x20),&local_bd0,1,&local_9a0,target,
                 &secp256k1_scalar_zero);
      psVar14 = &local_9a0;
    }
    else {
      psVar15 = (secp256k1_scalar *)&local_a08;
      psStack_c30 = (secp256k1_strauss_point_state *)0x14fa01;
      secp256k1_ecmult_const(&local_aa0,(secp256k1_ge *)psVar15,(secp256k1_scalar *)local_c08);
      psStack_c30 = (secp256k1_strauss_point_state *)0x14fa14;
      secp256k1_ecmult_const(&local_b38,(secp256k1_ge *)psVar15,(secp256k1_scalar *)auStack_c28);
      psStack_c30 = (secp256k1_strauss_point_state *)0x14fa24;
      secp256k1_ecmult_const(&local_bd0,(secp256k1_ge *)psVar15,target);
      psVar14 = (secp256k1_gej *)auStack_c28;
    }
  }
  psStack_c30 = (secp256k1_strauss_point_state *)0x14fa3e;
  secp256k1_gej_add_var(&local_bd0,&local_bd0,&local_aa0,(secp256k1_fe *)0x0);
  psStack_c30 = (secp256k1_strauss_point_state *)0x14fa53;
  psVar12 = &local_bd0;
  secp256k1_gej_add_var(&local_bd0,&local_bd0,&local_b38,(secp256k1_fe *)0x0);
  psStack_c30 = (secp256k1_strauss_point_state *)0x14fa5b;
  psVar13 = &local_bd0;
  secp256k1_gej_verify(&local_bd0);
  if (local_bd0.infinity != 0) {
    return;
  }
  psStack_c30 = (secp256k1_strauss_point_state *)test_ecmult_constants_sha;
  test_ecmult_target_cold_1();
  out32 = (byte *)((ulong)psVar13 & 0xffffffff);
  pcStack_d88 = (code *)0x14faa7;
  lStack_d78 = extraout_RDX;
  auStack_cc0._104_8_ = &local_bd0;
  auStack_cc0._112_8_ = unaff_R12;
  auStack_cc0._120_8_ = unaff_R13;
  auStack_cc0._128_8_ = psVar15;
  auStack_cc0._136_8_ = psVar14;
  psStack_c30 = psVar11;
  scratch = secp256k1_scratch_space_create(CTX,0x10000);
  uStack_d7e = SUB84(psVar13,0);
  psVar14 = (secp256k1_gej *)auStack_cc0;
  auStack_cc0._0_8_ = 0xbb67ae856a09e667;
  auStack_cc0._8_8_ = 0xa54ff53a3c6ef372;
  auStack_cc0._16_8_ = 0x9b05688c510e527f;
  auStack_cc0._24_8_ = 0x5be0cd191f83d9ab;
  psVar16 = (secp256k1_sha256 *)0x0;
  auStack_cc0._96_8_ = 0;
  sStack_d50.d[0] = 0;
  sStack_d50.d[1] = 0;
  sStack_d50.d[2] = 0;
  sStack_d50.d[3] = 0;
  pcStack_d88 = (code *)0x14faee;
  secp256k1_scalar_verify(&sStack_d50);
  pcStack_d88 = (code *)0x14fafc;
  test_ecmult_accumulate((secp256k1_sha256 *)psVar14,&sStack_d50,scratch);
  sStack_d50.d[0] = 1;
  sStack_d50.d[1] = 0;
  sStack_d50.d[2] = 0;
  sStack_d50.d[3] = 0;
  pcStack_d88 = (code *)0x14fb17;
  secp256k1_scalar_verify(&sStack_d50);
  pcStack_d88 = (code *)0x14fb25;
  test_ecmult_accumulate((secp256k1_sha256 *)psVar14,&sStack_d50,scratch);
  pcStack_d88 = (code *)0x14fb30;
  secp256k1_scalar_negate(&sStack_d50,&sStack_d50);
  pcStack_d88 = (code *)0x14fb3e;
  test_ecmult_accumulate((secp256k1_sha256 *)psVar14,&sStack_d50,scratch);
  if (psVar12 != (secp256k1_gej *)0x0) {
    psVar14 = (secp256k1_gej *)0x0;
    psVar16 = &sStack_d30;
    out32 = abStack_d70;
    do {
      uStack_d7a = SUB82(psVar14,0);
      sStack_d30.s[0] = 0x6a09e667;
      sStack_d30.s[1] = 0xbb67ae85;
      sStack_d30.s[2] = 0x3c6ef372;
      sStack_d30.s[3] = 0xa54ff53a;
      sStack_d30.s[4] = 0x510e527f;
      sStack_d30.s[5] = 0x9b05688c;
      sStack_d30.s[6] = 0x1f83d9ab;
      sStack_d30.s[7] = 0x5be0cd19;
      sStack_d30.bytes = 0;
      pcStack_d88 = (code *)0x14fb95;
      secp256k1_sha256_write(psVar16,(uchar *)&uStack_d7e,6);
      pcStack_d88 = (code *)0x14fba0;
      secp256k1_sha256_finalize(psVar16,out32);
      pcStack_d88 = (code *)0x14fbad;
      secp256k1_scalar_set_b32(&sStack_d50,out32,(int *)0x0);
      pcStack_d88 = (code *)0x14fbc0;
      test_ecmult_accumulate((secp256k1_sha256 *)auStack_cc0,&sStack_d50,scratch);
      psVar14 = (secp256k1_gej *)((long)(psVar14->x).n + 1);
    } while (psVar12 != psVar14);
  }
  pcStack_d88 = (code *)0x14fbda;
  secp256k1_sha256_finalize((secp256k1_sha256 *)auStack_cc0,abStack_d70);
  lVar6 = 0;
  uVar10 = extraout_RAX;
  do {
    uVar8 = uVar10 & 0xffffffff;
    bVar2 = abStack_d70[lVar6];
    psVar7 = (secp256k1_ge *)(ulong)bVar2;
    bVar3 = *(byte *)(lStack_d78 + lVar6);
    hash = (secp256k1_sha256 *)(ulong)bVar3;
    uVar10 = (ulong)((uint)bVar2 - (uint)bVar3);
    if (bVar2 == bVar3) {
      uVar10 = uVar8;
    }
    iVar4 = (int)uVar10;
    if (bVar2 != bVar3) goto LAB_0014fc04;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x20);
  iVar4 = 0;
LAB_0014fc04:
  if (iVar4 == 0) {
    pcStack_d88 = (code *)0x14fc17;
    secp256k1_scratch_space_destroy(CTX,scratch);
    return;
  }
  pcStack_d88 = test_ecmult_accumulate;
  test_ecmult_constants_sha_cold_1();
  auStack_1a38 = (undefined1  [8])0x41;
  psStack_1a50 = (secp256k1_scalar *)0x14fc67;
  psStack_db0 = scratch;
  psStack_da8 = psVar16;
  psStack_da0 = psVar14;
  psStack_d98 = &sStack_d50;
  psStack_d90 = psVar12;
  pcStack_d88 = (code *)out32;
  secp256k1_gej_set_ge(&sStack_1850,&secp256k1_ge_const_g);
  psStack_1a50 = (secp256k1_scalar *)0x14fc74;
  secp256k1_gej_set_infinity(&sStack_18e8);
  psStack_1a50 = (secp256k1_scalar *)0x14fc8b;
  secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_17b8 + 1,(secp256k1_scalar *)psVar7);
  psVar11 = (secp256k1_strauss_point_state *)(asStack_1508[5].y.n + 3);
  psStack_1a50 = (secp256k1_scalar *)0x14fcdd;
  sStack_1980.x.n[0] = (uint64_t)asStack_1688;
  sStack_1980.x.n[1] = (uint64_t)asStack_1508;
  sStack_1980.x.n[2] = (uint64_t)psVar11;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)&sStack_1980,&sStack_17b8,1,&sStack_1850,
             (secp256k1_scalar *)psVar7,&secp256k1_scalar_zero);
  psStack_1a50 = (secp256k1_scalar *)0x14fd0d;
  auStack_1a30._0_8_ = asStack_1688;
  auStack_1a30._8_8_ = asStack_1508;
  auStack_1a30._16_8_ = psVar11;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)auStack_1a30,&sStack_1980,1,&sStack_18e8,
             &secp256k1_scalar_zero,(secp256k1_scalar *)psVar7);
  error_callback = (secp256k1_callback *)0xd0;
  psVar14 = (secp256k1_gej *)&CTX->error_callback;
  cb = (secp256k1_ecmult_multi_callback *)0x0;
  cbdata = (secp256k1_ge *)0x0;
  psStack_1a50 = (secp256k1_scalar *)0x14fd3e;
  psVar15 = (secp256k1_scalar *)psVar7;
  b = scratch_00;
  iVar4 = secp256k1_ecmult_multi_var
                    ((secp256k1_callback *)psVar14,(secp256k1_scratch *)scratch_00,
                     (secp256k1_gej *)(asStack_1508[5].y.n + 3),(secp256k1_scalar *)psVar7,
                     (secp256k1_ecmult_multi_callback *)0x0,(void *)0x0,0);
  if (iVar4 == 0) {
    psStack_1a50 = (secp256k1_scalar *)0x14fea1;
    test_ecmult_accumulate_cold_8();
LAB_0014fea1:
    psStack_1a50 = (secp256k1_scalar *)0x14fea6;
    test_ecmult_accumulate_cold_7();
LAB_0014fea6:
    psStack_1a50 = (secp256k1_scalar *)0x14feab;
    test_ecmult_accumulate_cold_6();
LAB_0014feab:
    psStack_1a50 = (secp256k1_scalar *)0x14feb0;
    test_ecmult_accumulate_cold_5();
LAB_0014feb0:
    psStack_1a50 = (secp256k1_scalar *)0x14feb5;
    test_ecmult_accumulate_cold_4();
LAB_0014feb5:
    psStack_1a50 = (secp256k1_scalar *)0x14feba;
    test_ecmult_accumulate_cold_3();
LAB_0014feba:
    psStack_1a50 = (secp256k1_scalar *)0x14febf;
    test_ecmult_accumulate_cold_2();
  }
  else {
    error_callback = &CTX->error_callback;
    psVar15 = &secp256k1_scalar_zero;
    cb = test_ecmult_accumulate_cb;
    psStack_1a50 = (secp256k1_scalar *)0x14fd79;
    b = scratch_00;
    psVar14 = (secp256k1_gej *)error_callback;
    cbdata = psVar7;
    iVar4 = secp256k1_ecmult_multi_var
                      (error_callback,(secp256k1_scratch *)scratch_00,asStack_1508,
                       &secp256k1_scalar_zero,test_ecmult_accumulate_cb,psVar7,1);
    if (iVar4 == 0) goto LAB_0014fea1;
    psStack_1a50 = (secp256k1_scalar *)0x14fd98;
    secp256k1_ecmult_const(asStack_1688,&secp256k1_ge_const_g,(secp256k1_scalar *)psVar7);
    psVar7 = (secp256k1_ge *)auStack_1a30;
    psStack_1a50 = (secp256k1_scalar *)0x14fdad;
    secp256k1_ge_set_gej_var(psVar7,&sStack_17b8 + 1);
    psVar14 = &sStack_17b8;
    psStack_1a50 = (secp256k1_scalar *)0x14fdbd;
    b = psVar7;
    iVar4 = secp256k1_gej_eq_ge_var(psVar14,psVar7);
    if (iVar4 == 0) goto LAB_0014fea6;
    psVar14 = &sStack_1980;
    b = (secp256k1_ge *)auStack_1a30;
    psStack_1a50 = (secp256k1_scalar *)0x14fdd7;
    iVar4 = secp256k1_gej_eq_ge_var(psVar14,b);
    if (iVar4 == 0) goto LAB_0014feab;
    psVar14 = (secp256k1_gej *)(asStack_1508[5].y.n + 3);
    b = (secp256k1_ge *)auStack_1a30;
    psStack_1a50 = (secp256k1_scalar *)0x14fdf1;
    iVar4 = secp256k1_gej_eq_ge_var(psVar14,b);
    if (iVar4 == 0) goto LAB_0014feb0;
    psVar14 = asStack_1508;
    b = (secp256k1_ge *)auStack_1a30;
    psStack_1a50 = (secp256k1_scalar *)0x14fe0b;
    iVar4 = secp256k1_gej_eq_ge_var(psVar14,b);
    if (iVar4 == 0) goto LAB_0014feb5;
    psVar14 = asStack_1688;
    b = (secp256k1_ge *)auStack_1a30;
    psStack_1a50 = (secp256k1_scalar *)0x14fe25;
    iVar4 = secp256k1_gej_eq_ge_var(psVar14,b);
    if (iVar4 == 0) goto LAB_0014feba;
    psStack_1a50 = (secp256k1_scalar *)0x14fe3a;
    secp256k1_ge_verify((secp256k1_ge *)auStack_1a30);
    if (auStack_1a30._96_4_ != 0) {
      auStack_1a30[0x68] = 0;
      sVar9 = 1;
LAB_0014fe80:
      psStack_1a50 = (secp256k1_scalar *)0x14fe8a;
      secp256k1_sha256_write(hash,auStack_1a30 + 0x68,sVar9);
      return;
    }
    psVar14 = (secp256k1_gej *)auStack_1a30;
    b = (secp256k1_ge *)(auStack_1a30 + 0x68);
    psVar7 = (secp256k1_ge *)auStack_1a38;
    psVar15 = (secp256k1_scalar *)0x0;
    psStack_1a50 = (secp256k1_scalar *)0x14fe6f;
    secp256k1_eckey_pubkey_serialize((secp256k1_ge *)psVar14,(uchar *)b,(size_t *)psVar7,0);
    if (auStack_1a38 == (undefined1  [8])0x41) {
      sVar9 = 0x41;
      goto LAB_0014fe80;
    }
  }
  psStack_1a50 = (secp256k1_scalar *)secp256k1_ecmult_multi_var;
  test_ecmult_accumulate_cold_1();
  psStack_1a50 = &secp256k1_scalar_zero;
  psStack_1a78 = asStack_1688;
  psStack_1a70 = error_callback;
  psStack_1a60 = psVar7;
  psStack_1a58 = psVar11;
  secp256k1_gej_set_infinity(r);
  if ((secp256k1_ge *)psVar15 != (secp256k1_ge *)0x0 || hash != (secp256k1_sha256 *)0x0) {
    if (hash != (secp256k1_sha256 *)0x0) {
      if (b != (secp256k1_ge *)0x0) {
        sVar9 = secp256k1_pippenger_max_points((secp256k1_callback *)psVar14,(secp256k1_scratch *)b)
        ;
        psVar16 = hash;
        if (sVar9 != 0) {
          uVar10 = 5000000;
          if (sVar9 < 5000000) {
            uVar10 = sVar9;
          }
          puVar1 = (undefined1 *)((long)&hash[-1].bytes + 7);
          uStack_2378 = (ulong)puVar1 / uVar10 + 1;
          psVar16 = (secp256k1_sha256 *)((ulong)puVar1 / uStack_2378 + 1);
        }
        if (sVar9 != 0) {
          if (psVar16 < (secp256k1_sha256 *)0x58) {
            sVar9 = secp256k1_scratch_max_allocation
                              ((secp256k1_callback *)psVar14,(secp256k1_scratch *)b,5);
            if (0x987 < sVar9) {
              uVar10 = sVar9 / 0x988;
              if (4999999 < uVar10) {
                uVar10 = 5000000;
              }
              puVar1 = (undefined1 *)((long)&hash[-1].bytes + 7);
              uStack_2378 = (ulong)puVar1 / uVar10 + 1;
              psVar16 = (secp256k1_sha256 *)((ulong)puVar1 / uStack_2378 + 1);
            }
            if (sVar9 < 0x988) goto LAB_0015005f;
            pcVar5 = secp256k1_ecmult_strauss_batch;
          }
          else {
            pcVar5 = secp256k1_ecmult_pippenger_batch;
          }
          lVar6 = 0;
          uVar10 = 0;
          while( true ) {
            psVar17 = psVar16;
            if (hash < psVar16) {
              psVar17 = hash;
            }
            psVar7 = (secp256k1_ge *)0x0;
            if (uVar10 == 0) {
              psVar7 = (secp256k1_ge *)psVar15;
            }
            iVar4 = (*pcVar5)(psVar14,b,&sStack_2350,psVar7,cb,cbdata,psVar17,lVar6);
            if (iVar4 == 0) break;
            secp256k1_gej_add_var(r,r,(secp256k1_gej *)&sStack_2350,(secp256k1_fe *)0x0);
            hash = (secp256k1_sha256 *)((long)hash - (long)psVar17);
            uVar10 = uVar10 + 1;
            lVar6 = (long)psVar16->s + lVar6;
            if (uStack_2378 == uVar10) {
              return;
            }
          }
          return;
        }
      }
LAB_0015005f:
      secp256k1_ecmult_multi_simple_var(r,psVar15,cb,cbdata,(size_t)hash);
      return;
    }
    sStack_2368.aux = asStack_1f40;
    sStack_2368.pre_a = asStack_1dc0;
    sStack_2368.ps = &sStack_2350;
    secp256k1_ecmult_strauss_wnaf(&sStack_2368,r,1,r,&secp256k1_scalar_zero,psVar15);
  }
  return;
}

Assistant:

static void test_ecmult_target(const secp256k1_scalar* target, int mode) {
    /* Mode: 0=ecmult_gen, 1=ecmult, 2=ecmult_const */
    secp256k1_scalar n1, n2;
    secp256k1_ge p;
    secp256k1_gej pj, p1j, p2j, ptj;

    /* Generate random n1,n2 such that n1+n2 = -target. */
    testutil_random_scalar_order_test(&n1);
    secp256k1_scalar_add(&n2, &n1, target);
    secp256k1_scalar_negate(&n2, &n2);

    /* Generate a random input point. */
    if (mode != 0) {
        testutil_random_ge_test(&p);
        secp256k1_gej_set_ge(&pj, &p);
    }

    /* EC multiplications */
    if (mode == 0) {
        secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx, &p1j, &n1);
        secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx, &p2j, &n2);
        secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx, &ptj, target);
    } else if (mode == 1) {
        secp256k1_ecmult(&p1j, &pj, &n1, &secp256k1_scalar_zero);
        secp256k1_ecmult(&p2j, &pj, &n2, &secp256k1_scalar_zero);
        secp256k1_ecmult(&ptj, &pj, target, &secp256k1_scalar_zero);
    } else {
        secp256k1_ecmult_const(&p1j, &p, &n1);
        secp256k1_ecmult_const(&p2j, &p, &n2);
        secp256k1_ecmult_const(&ptj, &p, target);
    }

    /* Add them all up: n1*P + n2*P + target*P = (n1+n2+target)*P = (n1+n1-n1-n2)*P = 0. */
    secp256k1_gej_add_var(&ptj, &ptj, &p1j, NULL);
    secp256k1_gej_add_var(&ptj, &ptj, &p2j, NULL);
    CHECK(secp256k1_gej_is_infinity(&ptj));
}